

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementLog.cpp
# Opt level: O2

void __thiscall Rml::Debugger::ElementLog::AddLogMessage(ElementLog *this,Type type,String *message)

{
  const_iterator __position;
  ElementDocument *pEVar1;
  string *psVar2;
  LogMessageList *this_00;
  allocator<char> local_a9;
  Property local_a8;
  LogMessage log_message;
  
  this_00 = &this->log_types[type].log_messages;
  __position._M_current =
       (this_00->
       super__Vector_base<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if (0x31 < (ulong)(((long)this->log_types[type].log_messages.
                            super__Vector_base<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current
                     ) / 0x28)) {
    std::
    vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
    ::erase(this_00,__position);
  }
  log_message.message._M_dataplus._M_p = (pointer)&log_message.message.field_2;
  log_message.message._M_string_length = 0;
  log_message.message.field_2._M_local_buf[0] = '\0';
  log_message.index = this->current_index;
  this->current_index = log_message.index + 1;
  Rml::StringUtilities::EncodeRml((string *)&local_a8);
  std::__cxx11::string::operator=((string *)&log_message.message,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<Rml::Debugger::ElementLog::LogMessage,_std::allocator<Rml::Debugger::ElementLog::LogMessage>_>
  ::push_back(this_00,&log_message);
  if (this->log_types[type].visible == false) {
    if (this->log_types[type].button_name._M_string_length != 0) {
      psVar2 = (string *)Rml::Element::GetElementById((string *)this);
      if (psVar2 != (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Off*",&local_a9);
        Rml::Element::SetInnerRML(psVar2);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
  }
  else {
    pEVar1 = this->beacon;
    if ((pEVar1 != (ElementDocument *)0x0) && ((int)type < this->current_beacon_level)) {
      Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_a8,Visible);
      Rml::Element::SetProperty((PropertyId)pEVar1,(Property *)0x2a);
      Property::~Property(&local_a8);
      this->current_beacon_level = type;
      psVar2 = (string *)Rml::Element::GetFirstChild();
      if (psVar2 != (string *)0x0) {
        Rml::Element::SetClassNames(psVar2);
        Rml::Element::SetInnerRML(psVar2);
      }
      Rml::ElementDocument::UpdateDocument();
    }
  }
  this->dirty_logs = true;
  std::__cxx11::string::~string((string *)&log_message.message);
  return;
}

Assistant:

void ElementLog::AddLogMessage(Log::Type type, const String& message)
{
	LogMessageList& log_message_list = log_types[type].log_messages;
	if (log_message_list.size() >= MAX_LOG_MESSAGES)
	{
		log_message_list.erase(log_message_list.begin());
	}

	// Add the message to the list of messages for the specified log type.
	LogMessage log_message;
	log_message.index = current_index++;
	log_message.message = StringUtilities::EncodeRml(message);
	log_message_list.push_back(log_message);

	// If this log type is invisible, and there is a button for this log type, then change its text from
	// "Off" to "Off*" to signal that there are unread logs.
	if (!log_types[type].visible)
	{
		if (!log_types[type].button_name.empty())
		{
			Element* button = GetElementById(log_types[type].button_name);
			if (button)
			{
				button->SetInnerRML("Off*");
			}
		}
	}
	// Trigger the beacon if we're hidden. Override any lower-level log type if it is already visible.
	else
	{
		if (beacon != nullptr)
		{
			if (type < current_beacon_level)
			{
				beacon->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

				current_beacon_level = type;
				Element* beacon_button = beacon->GetFirstChild();
				if (beacon_button)
				{
					beacon_button->SetClassNames(log_types[type].class_name);
					beacon_button->SetInnerRML(log_types[type].alert_contents);
				}

				// We need to update the document manually in case the beacon appears during context update.
				beacon->UpdateDocument();
			}
		}
	}

	// Force a refresh of the RML.
	dirty_logs = true;
}